

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCurrentChar(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  int *val_00;
  int local_34;
  int n_len;
  int *len;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (len._4_4_ = 0; (int)len._4_4_ < 3; len._4_4_ = len._4_4_ + 1) {
    for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlParserCtxtPtr(len._4_4_,0);
      val_00 = gen_int_ptr(local_34,1);
      iVar2 = xmlCurrentChar(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlParserCtxtPtr(len._4_4_,val,0);
      des_int_ptr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCurrentChar",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)len._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlCurrentChar(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlParserCtxtPtr ctxt; /* the XML parser context */
    int n_ctxt;
    int * len; /* pointer to the length of the char read */
    int n_len;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_len = 0;n_len < gen_nb_int_ptr;n_len++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        len = gen_int_ptr(n_len, 1);

        ret_val = xmlCurrentChar(ctxt, len);
        desret_int(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_int_ptr(n_len, len, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCurrentChar",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}